

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

int Curl_cpool_init(cpool *cpool,Curl_cpool_disconnect_cb *disconnect_cb,Curl_multi *multi,
                   Curl_share *share,size_t size)

{
  CURL *pCVar1;
  size_t size_local;
  Curl_share *share_local;
  Curl_multi *multi_local;
  Curl_cpool_disconnect_cb *disconnect_cb_local;
  cpool *cpool_local;
  
  Curl_hash_init(&cpool->dest2bundle,size,Curl_hash_str,Curl_str_key_compare,cpool_bundle_free_entry
                );
  Curl_llist_init(&cpool->shutdowns,(Curl_llist_dtor)0x0);
  if (disconnect_cb == (Curl_cpool_disconnect_cb *)0x0) {
    cpool_local._4_4_ = 1;
  }
  else {
    pCVar1 = curl_easy_init();
    cpool->idata = pCVar1;
    if (cpool->idata == (Curl_easy *)0x0) {
      cpool_local._4_4_ = 1;
    }
    else {
      *(uint *)&(cpool->idata->state).field_0x774 =
           *(uint *)&(cpool->idata->state).field_0x774 & 0xfffbffff | 0x40000;
      cpool->idata->multi = multi;
      cpool->disconnect_cb = disconnect_cb;
      cpool->multi = multi;
      cpool->idata->multi = multi;
      cpool->share = share;
      cpool->idata->share = share;
      cpool_local._4_4_ = 0;
    }
  }
  return cpool_local._4_4_;
}

Assistant:

int Curl_cpool_init(struct cpool *cpool,
                        Curl_cpool_disconnect_cb *disconnect_cb,
                        struct Curl_multi *multi,
                        struct Curl_share *share,
                        size_t size)
{
  DEBUGASSERT(!!multi != !!share); /* either one */
  Curl_hash_init(&cpool->dest2bundle, size, Curl_hash_str,
                 Curl_str_key_compare, cpool_bundle_free_entry);
  Curl_llist_init(&cpool->shutdowns, NULL);

  DEBUGASSERT(disconnect_cb);
  if(!disconnect_cb)
    return 1;

  /* allocate a new easy handle to use when closing cached connections */
  cpool->idata = curl_easy_init();
  if(!cpool->idata)
    return 1; /* bad */
  cpool->idata->state.internal = TRUE;
  /* TODO: this is quirky. We need an internal handle for certain
   * operations, but we do not add it to the multi (if there is one).
   * But we give it the multi so that socket event operations can work.
   * Probably better to have an internal handle owned by the multi that
   * can be used for cpool operations. */
  cpool->idata->multi = multi;
 #ifdef DEBUGBUILD
  if(getenv("CURL_DEBUG"))
    cpool->idata->set.verbose = TRUE;
#endif

  cpool->disconnect_cb = disconnect_cb;
  cpool->idata->multi = cpool->multi = multi;
  cpool->idata->share = cpool->share = share;

  return 0; /* good */
}